

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

double pbrt::parseNumber(Token *t)

{
  char *pcVar1;
  byte bVar2;
  byte *args;
  int *piVar3;
  int iVar4;
  pointer __p_00;
  size_t sVar5;
  long lVar6;
  int *processed_characters_count;
  pointer __p;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> __nptr;
  long in_FS_OFFSET;
  float fVar7;
  double dVar8;
  string_view s;
  int length;
  unique_ptr<char[],_std::default_delete<char[]>_> allocBuf;
  char *endptr;
  char buf [64];
  
  if ((t->token)._M_len == 1) {
    args = (byte *)(t->token)._M_str;
    bVar2 = *args;
    if (9 < (byte)(bVar2 - 0x30)) {
      ErrorExit<char_const&>(&t->loc,"\"%c\": expected a number",(char *)args);
    }
    dVar8 = (double)(int)(bVar2 - 0x30);
  }
  else {
    allocBuf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
    if (parseNumber(pbrt::Token_const&)::reg == '\0') {
      iVar4 = __cxa_guard_acquire(&parseNumber(pbrt::Token_const&)::reg);
      if (iVar4 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)&parseNumber(pbrt::Token_const&)::reg,
                   parseNumber(pbrt::Token_const&)::$_0::__invoke(pbrt::StatsAccumulator__,
                   (PixelAccumFunc)0x0);
        __cxa_guard_release(&parseNumber(pbrt::Token_const&)::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x6a0) = *(long *)(in_FS_OFFSET + -0x6a0) + 1;
    sVar5 = (t->token)._M_len;
    if (sVar5 - 0x3f < 0xffffffffffffffc0) {
      *(long *)(in_FS_OFFSET + -0x6a8) = *(long *)(in_FS_OFFSET + -0x6a8) + 1;
      __p_00 = (pointer)operator_new__(sVar5 + 1);
      memset(__p_00,0,sVar5 + 1);
      endptr = (char *)0x0;
      std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&allocBuf,__p_00);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)&endptr);
      sVar5 = (t->token)._M_len;
      __nptr._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (tuple<char_*,_std::default_delete<char[]>_>)
           (tuple<char_*,_std::default_delete<char[]>_>)allocBuf;
    }
    else {
      __nptr._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (tuple<char_*,_std::default_delete<char[]>_>)buf;
    }
    if (sVar5 == 0) {
      sVar5 = 0;
    }
    else {
      memmove((void *)__nptr._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                      super__Head_base<0UL,_char_*,_false>._M_head_impl,(t->token)._M_str,sVar5);
      sVar5 = (t->token)._M_len;
    }
    *(char *)((long)__nptr._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl + sVar5) = '\0';
    length = 0;
    processed_characters_count = (int *)0x0;
    piVar3 = (int *)(t->token)._M_len;
    do {
      if (piVar3 == processed_characters_count) {
        lVar6 = strtol((char *)__nptr._M_t.
                               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl,&endptr,10);
        dVar8 = (double)lVar6;
        length = (int)endptr -
                 (int)__nptr._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                      super__Head_base<0UL,_char_*,_false>._M_head_impl;
        goto LAB_002b1fa7;
      }
      pcVar1 = (t->token)._M_str + (long)processed_characters_count;
      processed_characters_count = (int *)((long)processed_characters_count + 1);
    } while ((byte)(*pcVar1 - 0x30U) < 10);
    processed_characters_count = &length;
    fVar7 = double_conversion::StringToDoubleConverter::StringToFloat
                      ((StringToDoubleConverter *)floatParser,
                       (char *)__nptr._M_t.
                               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl,(int)piVar3,
                       processed_characters_count);
    dVar8 = (double)fVar7;
LAB_002b1fa7:
    if (length == 0) {
      s._M_str = (char *)processed_characters_count;
      s._M_len = (size_t)(t->token)._M_str;
      toString_abi_cxx11_((string *)&endptr,(pbrt *)(t->token)._M_len,s);
      ErrorExit<std::__cxx11::string>
                (&t->loc,"%s: expected a number",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&endptr);
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&allocBuf);
  }
  return dVar8;
}

Assistant:

static double parseNumber(const Token &t) {
    // Fast path for a single digit
    if (t.token.size() == 1) {
        if (!(t.token[0] >= '0' && t.token[0] <= '9'))
            ErrorExit(&t.loc, "\"%c\": expected a number", t.token[0]);
        return t.token[0] - '0';
    }

    // Copy to a buffer so we can NUL-terminate it, as strto[idf]() expect.
    char buf[64];
    char *bufp = buf;
    std::unique_ptr<char[]> allocBuf;
    CHECK_RARE(1e-5, t.token.size() + 1 >= sizeof(buf));
    if (t.token.size() + 1 >= sizeof(buf)) {
        // This should be very unusual, but is necessary in case we get a
        // goofball number with lots of leading zeros, for example.
        allocBuf = std::make_unique<char[]>(t.token.size() + 1);
        bufp = allocBuf.get();
    }

    std::copy(t.token.begin(), t.token.end(), bufp);
    bufp[t.token.size()] = '\0';

    // Can we just use strtol?
    auto isInteger = [](std::string_view str) {
        for (char ch : str)
            if (!(ch >= '0' && ch <= '9'))
                return false;
        return true;
    };

    int length = 0;
    double val;
    if (isInteger(t.token)) {
        char *endptr;
        val = double(strtol(bufp, &endptr, 10));
        length = endptr - bufp;
    } else if (sizeof(Float) == sizeof(float))
        val = floatParser.StringToFloat(bufp, t.token.size(), &length);
    else
        val = floatParser.StringToDouble(bufp, t.token.size(), &length);

    if (length == 0)
        ErrorExit(&t.loc, "%s: expected a number", toString(t.token));

    return val;
}